

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_key_size_helper(char *buf,size_t buf_size,char *name)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = snprintf(buf,buf_size,"%s key size",name);
  iVar2 = 0;
  if (buf_size <= uVar1) {
    iVar2 = -0x2980;
  }
  if ((int)uVar1 < 0) {
    iVar2 = -0x2980;
  }
  return iVar2;
}

Assistant:

int mbedtls_x509_key_size_helper(char *buf, size_t buf_size, const char *name)
{
    char *p = buf;
    size_t n = buf_size;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    ret = mbedtls_snprintf(p, n, "%s key size", name);
    MBEDTLS_X509_SAFE_SNPRINTF;

    return 0;
}